

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFWriter.cpp
# Opt level: O1

BitMatrix *
ZXing::Pdf417::BitMatrixFromBitArray
          (BitMatrix *__return_storage_ptr__,
          vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
          *input,int margin)

{
  pointer pvVar1;
  pointer puVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  
  pvVar1 = (input->
           super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  iVar8 = (*(int *)&(((_Bit_iterator *)
                     ((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data + 0x10))->super__Bit_iterator_base)._M_p -
          *(int *)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                   super__Bvector_impl_data) * 8 +
          *(uint *)((long)&(pvVar1->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                           super__Bvector_impl_data + 0x18);
  uVar3 = (int)((long)(input->
                      super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) * -0x33333333
  ;
  BitMatrix::BitMatrix(__return_storage_ptr__,iVar8 + margin * 2,uVar3 + margin * 2);
  if (0 < (int)uVar3) {
    iVar9 = ~margin + __return_storage_ptr__->_height;
    uVar4 = 0;
    do {
      if (0 < iVar8) {
        uVar6 = 0;
        lVar5 = (long)margin;
        do {
          if ((*(ulong *)(*(long *)&(input->
                                    super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start[uVar4].
                                    super__Bvector_base<std::allocator<bool>_>._M_impl.
                                    super__Bvector_impl_data + (uVar6 >> 6) * 8) >> (uVar6 & 0x3f) &
              1) != 0) {
            lVar7 = (long)(__return_storage_ptr__->_width * iVar9);
            puVar2 = (__return_storage_ptr__->_bits).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(__return_storage_ptr__->_bits).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)puVar2) <=
                (ulong)(lVar5 + lVar7)) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                        );
            }
            puVar2[lVar5 + lVar7] = 0xff;
          }
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + 1;
        } while ((long)uVar6 < (long)iVar8);
      }
      uVar4 = uVar4 + 1;
      iVar9 = iVar9 + -1;
    } while (uVar4 != (uVar3 & 0x7fffffff));
  }
  return __return_storage_ptr__;
}

Assistant:

static BitMatrix BitMatrixFromBitArray(const std::vector<std::vector<bool>>& input, int margin)
{
	// Creates the bitmatrix with extra space for whitespace
	int width = Size(input[0]);
	int height = Size(input);
	BitMatrix result(width + 2 * margin, height + 2 * margin);
	for (int y = 0, yOutput = static_cast<int>(result.height()) - margin - 1; y < height; y++, yOutput--) {
		for (int x = 0; x < width; ++x) {
			// Zero is white in the bytematrix
			if (input[y][x]) {
				result.set(x + margin, yOutput);
			}
		}
	}
	return result;
}